

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfInputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_3::InputFile::Data::fillBuffer
          (Data *this,ConstIterator to,int scanline1,int scanline2,int yStart,int xStart,int width)

{
  Slice *__src;
  ArgExc *this_00;
  long lVar1;
  int in_ECX;
  int in_EDX;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int x_2;
  float fill_2;
  int x_1;
  half fill_1;
  int x;
  uint fill;
  char *toPtr;
  int y;
  Slice toSlice;
  char *in_stack_ffffffffffffff68;
  half *in_stack_ffffffffffffff70;
  int local_88;
  int local_80;
  undefined2 local_7a;
  int local_78;
  float *local_70;
  int local_68;
  undefined4 local_58 [2];
  long local_50;
  long local_48;
  long local_40;
  int local_38;
  int local_34;
  double local_30;
  byte local_28;
  byte local_27;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  
  local_20 = in_R9D;
  local_1c = in_R8D;
  local_18 = in_ECX;
  local_14 = in_EDX;
  __src = FrameBuffer::ConstIterator::slice((ConstIterator *)0x1874f3);
  memcpy(local_58,__src,0x38);
  if ((local_38 == 1) && (local_34 == 1)) {
    for (local_68 = local_14; local_68 <= local_18; local_68 = local_68 + 1) {
      if ((local_27 & 1) == 0) {
        lVar1 = (long)local_68;
      }
      else {
        lVar1 = (long)local_68 - (long)local_1c;
      }
      local_70 = (float *)(lVar1 * local_40 + local_50);
      if ((local_28 & 1) == 0) {
        local_70 = (float *)(local_20 * local_48 + (long)local_70);
      }
      switch(local_58[0]) {
      case 0:
        for (local_78 = 0; local_78 < in_stack_00000008; local_78 = local_78 + 1) {
          *local_70 = (float)(long)local_30;
          local_70 = (float *)(local_48 + (long)local_70);
        }
        break;
      case 1:
        Imath_3_1::half::half(in_stack_ffffffffffffff70,0.0);
        for (local_80 = 0; local_80 < in_stack_00000008; local_80 = local_80 + 1) {
          *(undefined2 *)local_70 = local_7a;
          local_70 = (float *)(local_48 + (long)local_70);
        }
        break;
      case 2:
        for (local_88 = 0; local_88 < in_stack_00000008; local_88 = local_88 + 1) {
          *local_70 = (float)local_30;
          local_70 = (float *)(local_48 + (long)local_70);
        }
        break;
      case 3:
      }
    }
    return;
  }
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_3::ArgExc::ArgExc(this_00,in_stack_ffffffffffffff68);
  __cxa_throw(this_00,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
}

Assistant:

void
InputFile::Data::fillBuffer (FrameBuffer::ConstIterator to,
                             int scanline1, int scanline2,
                             int yStart, int xStart, int width)
{
    Slice toSlice = to.slice ();
    if (toSlice.xSampling != 1 || toSlice.ySampling != 1)
        throw IEX_NAMESPACE::ArgExc ("Tiled data should not have subsampling.");

    for (int y = scanline1; y <= scanline2; ++y)
    {
        char* toPtr = toSlice.base;

        if (toSlice.yTileCoords)
            toPtr += ( int64_t (y) - int64_t (yStart) ) * toSlice.yStride;
        else
            toPtr += int64_t (y) * toSlice.yStride;
        if (!toSlice.xTileCoords)
            toPtr += int64_t (xStart) * toSlice.xStride;

        //
        // Copy all pixels for the scanline in this row of tiles
        //

        switch (toSlice.type)
        {
            case UINT:
            {
                unsigned int fill =
                    static_cast<unsigned int> (toSlice.fillValue);
                for (int x = 0; x < width; ++x)
                {
                    *reinterpret_cast<unsigned int*> (toPtr) = fill;
                    toPtr += toSlice.xStride;
                }
                break;
            }
            case HALF:
            {
                half fill = toSlice.fillValue;
                for (int x = 0; x < width; ++x)
                {
                    *reinterpret_cast<half*> (toPtr) = fill;
                    toPtr += toSlice.xStride;
                }
                break;
            }
            case FLOAT:
            {
                float fill = toSlice.fillValue;
                for (int x = 0; x < width; ++x)
                {
                    *reinterpret_cast<float*> (toPtr) = fill;
                    toPtr += toSlice.xStride;
                }
                break;
            }
            case NUM_PIXELTYPES:
                break;
        }
    }
}